

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp,char>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,big_decimal_fp *fp,
          basic_format_specs<char> *specs,float_specs fspecs,char decimal_point)

{
  uint uVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int num_zeros;
  sign_t sign;
  int significand_size;
  anon_class_40_7_ef14d3db write;
  char *significand;
  int exp;
  undefined1 local_7d [5];
  sign_t local_78;
  int local_74;
  anon_class_56_7_a2a26a24 local_70;
  char ********local_38;
  int local_2c;
  float_specs local_28;
  
  local_38 = (char ********)fp->significand;
  local_74 = fp->significand_size;
  uVar10 = fspecs._4_4_;
  local_78 = uVar10 >> 8 & 0xff;
  local_7d[0] = decimal_point;
  local_28 = fspecs;
  if (local_74 < 0) goto LAB_0038b365;
  uVar11 = (ulong)((local_74 + 1) - (uint)(local_78 == none));
  uVar1 = fp->exponent;
  iVar9 = uVar1 + local_74;
  uVar3 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_0038b048:
    iVar6 = uVar1 + local_74 + -1;
    if ((uVar10 >> 0x14 & 1) == 0) {
      uVar5 = 0;
      uVar4 = (ulong)(byte)decimal_point;
      if (local_74 == 1) {
        uVar4 = uVar5;
      }
      cVar8 = (char)uVar4;
    }
    else {
      uVar5 = 0;
      if (0 < (int)(uVar3 - local_74)) {
        uVar5 = (ulong)(uVar3 - local_74);
      }
      uVar11 = uVar11 + uVar5;
      cVar8 = decimal_point;
    }
    local_70.sign = (sign_t *)(CONCAT44(local_70.sign._4_4_,uVar10 >> 8) & 0xffffffff000000ff);
    local_70.significand_size._0_5_ = CONCAT14(cVar8,local_74);
    local_70.fp = (big_decimal_fp *)
                  (CONCAT35(local_70.fp._5_3_,CONCAT14(((uVar10 >> 0x10 & 1) == 0) << 5,(int)uVar5))
                  | 0x4500000000);
    local_70.fspecs = (float_specs *)CONCAT44(local_70.fspecs._4_4_,iVar6);
    uVar5 = (ulong)specs->width;
    local_70.significand = (char **)local_38;
    if ((long)uVar5 < 1) {
      bVar2 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::big_decimal_fp,_char>
              ::anon_class_40_7_ef14d3db::operator()
                        ((anon_class_40_7_ef14d3db *)&local_70,out.container);
      return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar2.container;
    }
    if (iVar9 < 1) {
      iVar6 = 1 - iVar9;
    }
    lVar7 = 2;
    if (99 < iVar6) {
      lVar7 = (ulong)(999 < iVar6) + 3;
    }
    uVar11 = uVar11 + (3 - (ulong)(cVar8 == '\0')) + lVar7;
    uVar4 = 0;
    if (uVar11 <= uVar5) {
      uVar4 = uVar5 - uVar11;
    }
    uVar11 = uVar4 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                      (out,uVar11,&specs->fill);
    bVar2 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::big_decimal_fp,_char>
            ::anon_class_40_7_ef14d3db::operator()
                      ((anon_class_40_7_ef14d3db *)&local_70,bVar2.container);
    goto LAB_0038b293;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    uVar12 = 0x10;
    if (0 < (int)uVar3) {
      uVar12 = uVar3;
    }
    if ((iVar9 < -3) || ((int)uVar12 < iVar9)) goto LAB_0038b048;
  }
  local_2c = iVar9;
  if ((int)uVar1 < 0) {
    if (iVar9 < 1) {
      uVar10 = -iVar9;
      local_7d._1_4_ = uVar10;
      if (SBORROW4(uVar3,uVar10) != (int)(uVar3 + iVar9) < 0) {
        local_7d._1_4_ = uVar3;
      }
      if ((int)uVar3 < 0) {
        local_7d._1_4_ = uVar10;
      }
      if (local_74 != 0) {
        local_7d._1_4_ = uVar10;
      }
      if (-1 < (int)local_7d._1_4_) {
        local_70.sign = &local_78;
        local_70.significand = (char **)(local_7d + 1);
        local_70.significand_size = &local_74;
        local_70.fp = (big_decimal_fp *)&local_28;
        local_70.fspecs = (float_specs *)local_7d;
        local_70.decimal_point = (char *)&local_38;
        uVar5 = (ulong)specs->width;
        if (-1 < (long)uVar5) {
          uVar11 = uVar11 + (uint)local_7d._1_4_ + 2;
          uVar4 = 0;
          if (uVar11 <= uVar5) {
            uVar4 = uVar5 - uVar11;
          }
          uVar11 = uVar4 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                      (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
          bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                            (out,uVar11,&specs->fill);
          bVar2.container =
               (buffer<char> *)
               write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::big_decimal_fp,_char>
               ::anon_class_48_6_9afe1116::operator()
                         ((anon_class_48_6_9afe1116 *)&local_70,bVar2.container);
          goto LAB_0038b293;
        }
      }
    }
    else {
      local_7d._1_4_ = uVar3 - local_74 & (int)(uVar10 << 0xb) >> 0x1f;
      local_70.decimal_point = local_7d + 1;
      local_70.sign = &local_78;
      local_70.significand = (char **)&local_38;
      local_70.significand_size = &local_74;
      local_70.fp = (big_decimal_fp *)&local_2c;
      local_70.fspecs = (float_specs *)local_7d;
      uVar5 = (ulong)specs->width;
      if (-1 < (long)uVar5) {
        uVar4 = (ulong)(uint)local_7d._1_4_;
        if ((int)local_7d._1_4_ < 1) {
          uVar4 = 0;
        }
        uVar11 = uVar4 + uVar11 + 1;
        uVar4 = 0;
        if (uVar11 <= uVar5) {
          uVar4 = uVar5 - uVar11;
        }
        uVar11 = uVar4 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                    (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
        bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                          (out,uVar11,&specs->fill);
        bVar2 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::big_decimal_fp,_char>
                ::anon_class_48_6_48d028d1::operator()
                          ((anon_class_48_6_48d028d1 *)&local_70,bVar2.container);
        goto LAB_0038b293;
      }
    }
    goto LAB_0038b365;
  }
  uVar11 = uVar1 + uVar11;
  local_7d._1_4_ = uVar3 - iVar9;
  if ((uVar10 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_7d._1_4_) {
      if ((int)local_7d._1_4_ < 1) goto LAB_0038b206;
    }
    else {
      local_7d._1_4_ = 1;
    }
    uVar11 = uVar11 + (uint)local_7d._1_4_;
  }
LAB_0038b206:
  local_70.sign = &local_78;
  local_70.significand = (char **)&local_38;
  local_70.significand_size = &local_74;
  local_70.fspecs = &local_28;
  local_70.decimal_point = local_7d;
  local_70.num_zeros = (int *)(local_7d + 1);
  uVar5 = (ulong)specs->width;
  local_70.fp = fp;
  if ((long)uVar5 < 0) {
LAB_0038b365:
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                ,0x146,"negative value");
  }
  uVar4 = 0;
  if (uVar11 <= uVar5) {
    uVar4 = uVar5 - uVar11;
  }
  uVar11 = uVar4 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                              (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
  bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                    (out,uVar11,&specs->fill);
  bVar2.container =
       (buffer<char> *)
       write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::big_decimal_fp,_char>
       ::anon_class_56_7_a2a26a24::operator()(&local_70,bVar2.container);
LAB_0038b293:
  bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                    (bVar2,uVar4 - uVar11,&specs->fill);
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar2.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}